

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::Subst_Forward
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZFMatrix<double> *b)

{
  undefined8 in_RSI;
  TPZFMatrix<double> *in_RDI;
  TPZStackEqnStorage<double> *unaff_retaddr;
  DecomposeType dec;
  DecomposeType dec_00;
  TPZFMatrix<double> *f;
  
  dec_00 = (DecomposeType)((ulong)in_RSI >> 0x20);
  f = in_RDI;
  std::operator<<((ostream *)&std::cout,"Entering Forward Substitution\n");
  std::ostream::flush();
  TPZFront<double>::GetDecomposeType((TPZFront<double> *)&in_RDI[899].fPivot);
  TPZStackEqnStorage<double>::Forward(unaff_retaddr,f,dec_00);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}